

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O0

uint class_to_size(uint c)

{
  uint c_local;
  
  return (c - 3 & 3 | 4) << ((char)(c - 3 >> 2) - 2U & 0x1f);
}

Assistant:

static unsigned int class_to_size(unsigned int c)
{
#if LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO == 0
	return 2 << c;
#else
#if LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO >= CODE3264(2, 3)
	if (unlikely(c < (LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO << LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO)))//for block sizes less than or equal to pow(2, LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO)
		return 2 << (c >> LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO);
	else
#endif
	{
		c -= (1 << LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO) - 1;
		return ((c & ((1 << LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO) - 1)) | (1 << LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO)) << ((c >> LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO) - LTALLOC_SIZE_CLASSES_SUBPOWER_OF_TWO);
	}
#endif
}